

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O1

uint __thiscall
xercesc_4_0::NamespaceScope::getNamespaceForPrefix(NamespaceScope *this,XMLCh *prefixToMap)

{
  uint uVar1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar2;
  PrefMapElem *pPVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  PoolElem *pPVar7;
  uint uVar8;
  XMLCh *pXVar9;
  XMLCh XVar10;
  long lVar11;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar12;
  
  pRVar2 = (this->fPrefixPool).fHashTable;
  if ((prefixToMap == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*prefixToMap, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar10 = prefixToMap[1];
    if (XVar10 != L'\0') {
      pXVar9 = prefixToMap + 2;
      do {
        uVar6 = (ulong)(ushort)XVar10 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar10 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar10 != L'\0');
    }
    uVar6 = uVar6 % pRVar2->fHashModulus;
  }
  pRVar12 = pRVar2->fBucketList[uVar6];
  if (pRVar12 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar5 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,prefixToMap,pRVar12->fKey);
      if (bVar5) goto LAB_0031ca76;
      pRVar12 = pRVar12->fNext;
    } while (pRVar12 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  pRVar12 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_0031ca76:
  uVar8 = 0;
  if (pRVar12 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    pPVar7 = (PoolElem *)0x0;
  }
  else {
    pPVar7 = pRVar12->fData;
  }
  if (pPVar7 != (PoolElem *)0x0) {
    uVar8 = pPVar7->fId;
  }
  if (uVar8 != 0) {
    uVar6 = (ulong)this->fStackTop;
    bVar5 = uVar6 == 0;
    if (!bVar5) {
      do {
        uVar1 = this->fStack[uVar6 - 1]->fMapCount;
        if (uVar1 == 0) {
          bVar4 = false;
        }
        else {
          pPVar3 = this->fStack[uVar6 - 1]->fMap;
          lVar11 = 0;
          do {
            if (pPVar3[lVar11].fPrefId == uVar8) {
              pPVar7 = (PoolElem *)(ulong)pPVar3[lVar11].fURIId;
              bVar4 = true;
              goto LAB_0031cad9;
            }
            lVar11 = lVar11 + 1;
          } while (uVar1 != (uint)lVar11);
          bVar4 = false;
        }
LAB_0031cad9:
        if (bVar4) break;
        uVar6 = uVar6 - 1;
        bVar5 = uVar6 == 0;
      } while (!bVar5);
    }
    if (!bVar5) {
      return (uint)pPVar7;
    }
  }
  return this->fEmptyNamespaceId;
}

Assistant:

unsigned int
NamespaceScope::getNamespaceForPrefix(const XMLCh* const prefixToMap) const {

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = fPrefixPool.getId(prefixToMap);

    if (!prefixId){
        return fEmptyNamespaceId;
    }

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    for (unsigned int index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // If no prefixes mapped at this level, then go the next one
        if (!curRow->fMapCount)
            continue;

        // Search the map at this level for the passed prefix
        for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
        {
            if (curRow->fMap[mapIndex].fPrefId == prefixId)
                return curRow->fMap[mapIndex].fURIId;
        }
    }

    return fEmptyNamespaceId;
}